

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ConstCastTestT<char>(void)

{
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined8 uStack_8;
  
  uStack_8 = in_RAX;
  if (ConstCastTestT<char>()::b == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::b);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<char>();
      ConstCastTestT<char>::b = SVar1.m_int != '\0';
      __cxa_guard_release(&ConstCastTestT<char>()::b);
    }
  }
  if (ConstCastTestT<char>()::w == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::w);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<char>();
      ConstCastTestT<char>::w = (wchar_t)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<char>()::w);
    }
  }
  if (ConstCastTestT<char>()::c == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::c);
    if (iVar2 != 0) {
      ConstCastTestT<char>::c = (char)ConstSafeInt<char>();
      __cxa_guard_release(&ConstCastTestT<char>()::c);
    }
  }
  if (ConstCastTestT<char>()::sc == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::sc);
    if (iVar2 != 0) {
      ConstCastTestT<char>::sc = (char)ConstSafeInt<char>();
      __cxa_guard_release(&ConstCastTestT<char>()::sc);
    }
  }
  if (ConstCastTestT<char>()::uc == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::uc);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<char>();
      uStack_8 = CONCAT17(SVar1.m_int,(undefined7)uStack_8);
      ConstCastTestT<char>::uc =
           SafeInt::operator_cast_to_unsigned_char((SafeInt *)((long)&uStack_8 + 7));
      __cxa_guard_release(&ConstCastTestT<char>()::uc);
    }
  }
  if (ConstCastTestT<char>()::s == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::s);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<char>();
      ConstCastTestT<char>::s = (short)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<char>()::s);
    }
  }
  if (ConstCastTestT<char>()::us == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::us);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<char>();
      uStack_8._0_7_ = CONCAT16(SVar1.m_int,(undefined6)uStack_8);
      ConstCastTestT<char>::us =
           SafeInt::operator_cast_to_unsigned_short((SafeInt *)((long)&uStack_8 + 6));
      __cxa_guard_release(&ConstCastTestT<char>()::us);
    }
  }
  if (ConstCastTestT<char>()::i == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::i);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<char>();
      ConstCastTestT<char>::i = (int)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<char>()::i);
    }
  }
  if (ConstCastTestT<char>()::ui == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::ui);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<char>();
      uStack_8._0_6_ = CONCAT15(SVar1.m_int,(undefined5)uStack_8);
      ConstCastTestT<char>::ui =
           SafeInt::operator_cast_to_unsigned_int((SafeInt *)((long)&uStack_8 + 5));
      __cxa_guard_release(&ConstCastTestT<char>()::ui);
    }
  }
  if (ConstCastTestT<char>()::l == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::l);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<char>();
      ConstCastTestT<char>::l = (long)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<char>()::l);
    }
  }
  if (ConstCastTestT<char>()::ul == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::ul);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<char>();
      uStack_8._0_5_ = CONCAT14(SVar1.m_int,(undefined4)uStack_8);
      ConstCastTestT<char>::ul =
           SafeInt::operator_cast_to_unsigned_long((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<char>()::ul);
    }
  }
  if (ConstCastTestT<char>()::ll == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::ll);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<char>();
      ConstCastTestT<char>::ll = (longlong)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<char>()::ll);
    }
  }
  if (ConstCastTestT<char>()::ull == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::ull);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<char>();
      uStack_8._0_4_ = CONCAT13(SVar1.m_int,(undefined3)uStack_8);
      ConstCastTestT<char>::ull =
           SafeInt::operator_cast_to_unsigned_long_long((SafeInt *)((long)&uStack_8 + 3));
      __cxa_guard_release(&ConstCastTestT<char>()::ull);
    }
  }
  if (ConstCastTestT<char>()::st == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::st);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<char>();
      uStack_8._0_3_ = CONCAT12(SVar1.m_int,(undefined2)uStack_8);
      ConstCastTestT<char>::st =
           SafeInt::operator_cast_to_unsigned_long((SafeInt *)((long)&uStack_8 + 2));
      __cxa_guard_release(&ConstCastTestT<char>()::st);
    }
  }
  if (ConstCastTestT<char>()::pt == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::pt);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<char>();
      ConstCastTestT<char>::pt = (ptrdiff_t)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<char>()::pt);
    }
  }
  if (ConstCastTestT<char>()::pl == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<char>()::pl);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<char>();
      ConstCastTestT<char>::pl = (int)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<char>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}